

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int start_page_no_capturepattern(vorb *f)

{
  uint8 uVar1;
  byte bVar2;
  int iVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  int64_t iVar8;
  ulong uVar9;
  int iVar10;
  uint8 *puVar11;
  long lVar12;
  
  if (f->first_decode != '\0') {
    if (f->stream == (uint8 *)0x0) {
      iVar8 = (*f->f->seek)(f->f->data,0,1);
      iVar3 = (int)iVar8 - f->f_start;
    }
    else {
      iVar3 = (int)f->stream - *(int *)&f->stream_start;
    }
    (f->p_first).page_start = iVar3 - 4;
  }
  uVar1 = get8(f);
  if (uVar1 == '\0') {
    uVar1 = get8(f);
    f->page_flag = uVar1;
    uVar4 = get32(f);
    uVar5 = get32(f);
    get32(f);
    uVar6 = get32(f);
    f->last_page = uVar6;
    get32(f);
    bVar2 = get8(f);
    f->segment_count = (uint)bVar2;
    iVar3 = getn(f,f->segments,(uint)bVar2);
    if (iVar3 != 0) {
      f->end_seg_with_known_loc = -2;
      if ((uVar4 != 0xffffffff) || (uVar5 != 0xffffffff)) {
        uVar9 = (ulong)(uint)f->segment_count;
        puVar11 = f->segments + (uVar9 - 1);
        do {
          if ((int)uVar9 < 1) goto LAB_00121e0b;
          uVar7 = (int)uVar9 - 1;
          uVar9 = (ulong)uVar7;
          uVar1 = *puVar11;
          puVar11 = puVar11 + -1;
        } while (uVar1 == 0xff);
        f->end_seg_with_known_loc = uVar7;
        f->known_loc_for_packet = uVar4;
      }
LAB_00121e0b:
      if (f->first_decode != '\0') {
        iVar3 = f->segment_count;
        if ((long)iVar3 < 1) {
          iVar10 = 0x1b;
        }
        else {
          lVar12 = 0;
          iVar10 = 0;
          do {
            iVar10 = iVar10 + (uint)f->segments[lVar12];
            lVar12 = lVar12 + 1;
          } while (iVar3 != lVar12);
          iVar10 = iVar10 + 0x1b;
        }
        (f->p_first).page_end = iVar3 + iVar10 + (f->p_first).page_start;
        (f->p_first).last_decoded_sample = uVar4;
      }
      f->next_seg = 0;
      return 1;
    }
    f->error = VORBIS_unexpected_eof;
  }
  else {
    f->error = VORBIS_invalid_stream_structure_version;
  }
  return 0;
}

Assistant:

static int start_page_no_capturepattern(vorb *f)
{
   uint32 loc0,loc1,n;
   if (f->first_decode && !IS_PUSH_MODE(f)) {
      f->p_first.page_start = stb_vorbis_get_file_offset(f) - 4;
   }
   // stream structure version
   if (0 != get8(f)) return error(f, VORBIS_invalid_stream_structure_version);
   // header flag
   f->page_flag = get8(f);
   // absolute granule position
   loc0 = get32(f);
   loc1 = get32(f);
   // @TODO: validate loc0,loc1 as valid positions?
   // stream serial number -- vorbis doesn't interleave, so discard
   get32(f);
   //if (f->serial != get32(f)) return error(f, VORBIS_incorrect_stream_serial_number);
   // page sequence number
   n = get32(f);
   f->last_page = n;
   // CRC32
   get32(f);
   // page_segments
   f->segment_count = get8(f);
   if (!getn(f, f->segments, f->segment_count))
      return error(f, VORBIS_unexpected_eof);
   // assume we _don't_ know any the sample position of any segments
   f->end_seg_with_known_loc = -2;
   if (loc0 != ~0U || loc1 != ~0U) {
      int i;
      // determine which packet is the last one that will complete
      for (i=f->segment_count-1; i >= 0; --i)
         if (f->segments[i] < 255)
            break;
      // 'i' is now the index of the _last_ segment of a packet that ends
      if (i >= 0) {
         f->end_seg_with_known_loc = i;
         f->known_loc_for_packet   = loc0;
      }
   }
   if (f->first_decode) {
      int i,len;
      len = 0;
      for (i=0; i < f->segment_count; ++i)
         len += f->segments[i];
      len += 27 + f->segment_count;
      f->p_first.page_end = f->p_first.page_start + len;
      f->p_first.last_decoded_sample = loc0;
   }
   f->next_seg = 0;
   return TRUE;
}